

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall capnp::SchemaLoader::Impl::~Impl(Impl *this)

{
  Impl *this_local;
  
  kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::~HashMap
            (&this->structSizeRequirements);
  kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::~HashMap
            (&this->unboundBrands);
  kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::
  ~HashMap(&this->brands);
  kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::~HashMap(&this->schemas);
  kj::HashSet<kj::ArrayPtr<const_unsigned_char>_>::~HashSet(&this->dedupTable);
  kj::Arena::~Arena(&this->arena);
  return;
}

Assistant:

inline explicit Impl(const SchemaLoader& loader)
      : initializer(loader), brandedInitializer(loader) {}